

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi_cache.cpp
# Opt level: O3

void __thiscall
icu_63::RuleBasedBreakIterator::DictionaryCache::populateDictionary
          (DictionaryCache *this,int32_t startPos,int32_t endPos,int32_t firstRuleStatus,
          int32_t otherRuleStatus)

{
  UText *ut;
  ushort uVar1;
  RuleBasedBreakIterator *pRVar2;
  UTrie2 *pUVar3;
  uint16_t *puVar4;
  int32_t *piVar5;
  UBool UVar6;
  uint uVar7;
  int32_t iVar8;
  ushort *puVar9;
  int64_t iVar10;
  LanguageBreakEngine *pLVar11;
  int iVar12;
  ulong uVar13;
  UErrorCode status;
  int local_48;
  UErrorCode local_44;
  UVector32 *local_40;
  int32_t *local_38;
  
  if (endPos - startPos < 2) {
    return;
  }
  this->fPositionInCache = -1;
  local_40 = &this->fBreaks;
  this->fStart = 0;
  this->fLimit = 0;
  this->fFirstRuleStatusIndex = 0;
  this->fOtherRuleStatusIndex = 0;
  UVector32::removeAllElements(local_40);
  this->fFirstRuleStatusIndex = firstRuleStatus;
  this->fOtherRuleStatusIndex = otherRuleStatus;
  local_44 = U_ZERO_ERROR;
  pRVar2 = this->fBI;
  ut = &pRVar2->fText;
  utext_setNativeIndex_63(ut,(long)startPos);
  uVar7 = utext_current32_63(ut);
  pUVar3 = this->fBI->fData->fTrie;
  puVar4 = pUVar3->index;
  if (uVar7 < 0xd800) {
    uVar1 = puVar4[uVar7 >> 5];
  }
  else {
    if (uVar7 < 0x10000) {
      uVar13 = (ulong)((uVar7 >> 5) + 0x140);
      if (0xdbff < uVar7) {
        uVar13 = (ulong)(uVar7 >> 5);
      }
    }
    else {
      if (0x10ffff < uVar7) {
        iVar12 = pUVar3->indexLength + 0x80;
        goto LAB_0029d7a4;
      }
      if (pUVar3->highStart <= (int)uVar7) {
        iVar12 = pUVar3->highValueIndex;
        goto LAB_0029d7a4;
      }
      uVar13 = (ulong)((uVar7 >> 5 & 0x3f) + (uint)puVar4[(ulong)(uVar7 >> 0xb) + 0x820]);
    }
    uVar1 = puVar4[uVar13];
  }
  iVar12 = (uVar7 & 0x1f) + (uint)uVar1 * 4;
LAB_0029d7a4:
  local_38 = &this->fStart;
  puVar9 = puVar4 + iVar12;
  local_48 = 0;
  do {
    uVar1 = *puVar9;
    iVar12 = (pRVar2->fText).chunkOffset;
    if ((pRVar2->fText).nativeIndexingLimit < iVar12) {
      iVar10 = (*((pRVar2->fText).pFuncs)->mapOffsetToNative)(ut);
      iVar12 = (int)iVar10;
    }
    else {
      iVar12 = iVar12 + (int)(pRVar2->fText).chunkNativeStart;
    }
    if ((iVar12 < endPos) && ((uVar1 & 0x4000) == 0)) {
      utext_next32_63(ut);
    }
    else {
      if (endPos <= iVar12) break;
      pLVar11 = getLanguageBreakEngine(this->fBI,uVar7);
      if (pLVar11 != (LanguageBreakEngine *)0x0) {
        iVar12 = (*pLVar11->_vptr_LanguageBreakEngine[3])
                           (pLVar11,ut,(ulong)(uint)startPos,(ulong)(uint)endPos,local_40);
        local_48 = local_48 + iVar12;
      }
    }
    uVar7 = utext_current32_63(ut);
    pUVar3 = this->fBI->fData->fTrie;
    puVar4 = pUVar3->index;
    if (uVar7 < 0xd800) {
      uVar1 = puVar4[uVar7 >> 5];
LAB_0029d857:
      iVar12 = (uVar7 & 0x1f) + (uint)uVar1 * 4;
    }
    else {
      if (uVar7 < 0x10000) {
        uVar13 = (ulong)((uVar7 >> 5) + 0x140);
        if (0xdbff < uVar7) {
          uVar13 = (ulong)(uVar7 >> 5);
        }
LAB_0029d853:
        uVar1 = puVar4[uVar13];
        goto LAB_0029d857;
      }
      if (uVar7 < 0x110000) {
        if ((int)uVar7 < pUVar3->highStart) {
          uVar13 = (ulong)((uVar7 >> 5 & 0x3f) + (uint)puVar4[(ulong)(uVar7 >> 0xb) + 0x820]);
          goto LAB_0029d853;
        }
        iVar12 = pUVar3->highValueIndex;
      }
      else {
        iVar12 = pUVar3->indexLength + 0x80;
      }
    }
    puVar9 = puVar4 + iVar12;
  } while( true );
  if (local_48 < 1) {
    return;
  }
  uVar7 = (this->fBreaks).count;
  if ((int)uVar7 < 1) {
    iVar12 = 0;
  }
  else {
    iVar12 = *(this->fBreaks).elements;
  }
  if (startPos < iVar12) {
    UVector32::insertElementAt(local_40,startPos,0,&local_44);
    uVar7 = (this->fBreaks).count;
  }
  if ((int)uVar7 < 1) {
    iVar12 = 0;
  }
  else {
    iVar12 = (this->fBreaks).elements[(ulong)uVar7 - 1];
  }
  if (iVar12 < endPos) {
    if (((int)uVar7 < -1) || ((this->fBreaks).capacity <= (int)uVar7)) {
      UVar6 = UVector32::expandCapacity(local_40,uVar7 + 1,&local_44);
      uVar7 = (this->fBreaks).count;
      if (UVar6 == '\0') goto LAB_0029d978;
    }
    (this->fBreaks).elements[(int)uVar7] = endPos;
    uVar7 = (this->fBreaks).count + 1;
    (this->fBreaks).count = uVar7;
  }
LAB_0029d978:
  this->fPositionInCache = 0;
  if ((int)uVar7 < 1) {
    *local_38 = 0;
    iVar8 = 0;
  }
  else {
    piVar5 = (this->fBreaks).elements;
    this->fStart = *piVar5;
    iVar8 = piVar5[(ulong)uVar7 - 1];
  }
  this->fLimit = iVar8;
  return;
}

Assistant:

void RuleBasedBreakIterator::DictionaryCache::populateDictionary(int32_t startPos, int32_t endPos,
                                       int32_t firstRuleStatus, int32_t otherRuleStatus) {
    if ((endPos - startPos) <= 1) {
        return;
    }

    reset();
    fFirstRuleStatusIndex = firstRuleStatus;
    fOtherRuleStatusIndex = otherRuleStatus;

    int32_t rangeStart = startPos;
    int32_t rangeEnd = endPos;

    uint16_t    category;
    int32_t     current;
    UErrorCode  status = U_ZERO_ERROR;
    int32_t     foundBreakCount = 0;
    UText      *text = &fBI->fText;

    // Loop through the text, looking for ranges of dictionary characters.
    // For each span, find the appropriate break engine, and ask it to find
    // any breaks within the span.

    utext_setNativeIndex(text, rangeStart);
    UChar32     c = utext_current32(text);
    category = UTRIE2_GET16(fBI->fData->fTrie, c);

    while(U_SUCCESS(status)) {
        while((current = (int32_t)UTEXT_GETNATIVEINDEX(text)) < rangeEnd && (category & 0x4000) == 0) {
            utext_next32(text);           // TODO: cleaner loop structure.
            c = utext_current32(text);
            category = UTRIE2_GET16(fBI->fData->fTrie, c);
        }
        if (current >= rangeEnd) {
            break;
        }

        // We now have a dictionary character. Get the appropriate language object
        // to deal with it.
        const LanguageBreakEngine *lbe = fBI->getLanguageBreakEngine(c);

        // Ask the language object if there are any breaks. It will add them to the cache and
        // leave the text pointer on the other side of its range, ready to search for the next one.
        if (lbe != NULL) {
            foundBreakCount += lbe->findBreaks(text, rangeStart, rangeEnd, fBreaks);
        }

        // Reload the loop variables for the next go-round
        c = utext_current32(text);
        category = UTRIE2_GET16(fBI->fData->fTrie, c);
    }

    // If we found breaks, ensure that the first and last entries are
    // the original starting and ending position. And initialize the
    // cache iteration position to the first entry.

    // printf("foundBreakCount = %d\n", foundBreakCount);
    if (foundBreakCount > 0) {
        U_ASSERT(foundBreakCount == fBreaks.size());
        if (startPos < fBreaks.elementAti(0)) {
            // The dictionary did not place a boundary at the start of the segment of text.
            // Add one now. This should not commonly happen, but it would be easy for interactions
            // of the rules for dictionary segments and the break engine implementations to
            // inadvertently cause it. Cover it here, just in case.
            fBreaks.insertElementAt(startPos, 0, status);
        }
        if (endPos > fBreaks.peeki()) {
            fBreaks.push(endPos, status);
        }
        fPositionInCache = 0;
        // Note: Dictionary matching may extend beyond the original limit.
        fStart = fBreaks.elementAti(0);
        fLimit = fBreaks.peeki();
    } else {
        // there were no language-based breaks, even though the segment contained
        // dictionary characters. Subsequent attempts to fetch boundaries from the dictionary cache
        // for this range will fail, and the calling code will fall back to the rule based boundaries.
    }
}